

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_rayquery_function
          (CompilerHLSL *this,char *commited,char *candidate,uint32_t *ops)

{
  uint32_t result_type;
  uint32_t result_id;
  uint32_t uVar1;
  char **ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  char *candidate_local;
  string local_78;
  char *commited_local;
  string local_50;
  
  candidate_local = candidate;
  commited_local = commited;
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,*ops);
  uVar1 = Compiler::evaluate_constant_u32((Compiler *)this,ops[3]);
  result_type = *ops;
  result_id = ops[1];
  ts_1 = (char **)&DAT_00000001;
  CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,ops[2],true);
  ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commited_local;
  if (uVar1 == 0) {
    ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&candidate_local;
  }
  join<std::__cxx11::string,char_const*&>(&local_78,(spirv_cross *)&local_50,ts,ts_1);
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_78,false,false);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CompilerHLSL::emit_rayquery_function(const char *commited, const char *candidate, const uint32_t *ops)
{
	flush_variable_declaration(ops[0]);
	uint32_t is_commited = evaluate_constant_u32(ops[3]);
	emit_op(ops[0], ops[1], join(to_expression(ops[2]), is_commited ? commited : candidate), false);
}